

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RC interp(NODE *n)

{
  NODE *n_00;
  RelAttr *pRVar1;
  int iVar2;
  AttrType AVar3;
  int nConditions;
  RC RVar4;
  size_t sVar5;
  node *pnVar6;
  AttrType AVar7;
  AttrType *pAVar8;
  char **ppcVar9;
  Condition *extraout_RDX;
  Condition *extraout_RDX_00;
  long lVar10;
  Condition *pCVar11;
  Condition *pCVar12;
  char *pcVar13;
  char *pcVar14;
  node *pnVar15;
  int *piVar16;
  long lVar17;
  RelAttr local_cc8;
  Value rhsValue;
  RelAttr relAttrs [40];
  AttrInfo attrInfos [40];
  
  iVar2 = isatty(0);
  pCVar11 = extraout_RDX;
  if (iVar2 != 0) goto LAB_0011a51a;
  switch(n->kind) {
  case N_CREATETABLE:
    printf("create table %s (",(n->u).CREATETABLE.relname);
    for (pnVar6 = (n->u).CREATETABLE.attrlist;
        (pnVar6 != (node *)0x0 &&
        (pnVar15 = (pnVar6->u).QUERY.relattrlist,
        printf("%s = %s",(pnVar15->u).CREATETABLE.relname,(pnVar15->u).CREATETABLE.attrlist),
        (pnVar6->u).CREATETABLE.attrlist != (node *)0x0)); pnVar6 = (pnVar6->u).CREATETABLE.attrlist
        ) {
      printf(", ");
    }
    putchar(0x29);
    break;
  case N_CREATEINDEX:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar6 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "create index %s(%s);\n";
    goto LAB_0011a3c4;
  case N_DROPTABLE:
    pcVar14 = (n->u).CREATETABLE.relname;
    pcVar13 = "drop table %s;\n";
    goto LAB_0011a398;
  case N_DROPINDEX:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar6 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "drop index %s(%s);\n";
    goto LAB_0011a3c4;
  case N_LOAD:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar6 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "load %s(\"%s\");\n";
    goto LAB_0011a3c4;
  case N_SET:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar6 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "set %s = \"%s\";\n";
LAB_0011a3c4:
    printf(pcVar13,pcVar14,pnVar6);
    goto switchD_0011a263_default;
  case N_HELP:
    printf("help");
    if ((n->u).CREATETABLE.relname != (char *)0x0) {
      printf(" %s");
    }
    break;
  case N_PRINT:
    pcVar14 = (n->u).CREATETABLE.relname;
    pcVar13 = "print %s;\n";
LAB_0011a398:
    printf(pcVar13,pcVar14);
    goto switchD_0011a263_default;
  case N_QUERY:
    printf("select ");
    for (pnVar6 = (n->u).QUERY.relattrlist;
        (pnVar6 != (node *)0x0 &&
        (print_relattr((pnVar6->u).QUERY.relattrlist),
        (pnVar6->u).CREATETABLE.attrlist != (node *)0x0)); pnVar6 = (pnVar6->u).CREATETABLE.attrlist
        ) {
      putchar(0x2c);
    }
    printf("\n from ");
    for (pnVar6 = (n->u).CREATETABLE.attrlist;
        (pnVar6 != (node *)0x0 &&
        (printf(" %s",(((pnVar6->u).QUERY.relattrlist)->u).CREATETABLE.relname),
        (pnVar6->u).CREATETABLE.attrlist != (node *)0x0)); pnVar6 = (pnVar6->u).CREATETABLE.attrlist
        ) {
      putchar(0x2c);
    }
    putchar(10);
    if ((n->u).QUERY.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar6 = (n->u).QUERY.conditionlist;
LAB_0011a4fa:
      print_conditions(pnVar6);
    }
    break;
  case N_INSERT:
    printf("insert into %s values ( ",(n->u).CREATETABLE.relname);
    for (pnVar6 = (n->u).CREATETABLE.attrlist;
        (pnVar6 != (node *)0x0 &&
        (print_value((pnVar6->u).QUERY.relattrlist), (pnVar6->u).CREATETABLE.attrlist != (node *)0x0
        )); pnVar6 = (pnVar6->u).CREATETABLE.attrlist) {
      putchar(0x2c);
    }
    pcVar14 = ");";
    goto LAB_0011a506;
  case N_DELETE:
    printf("delete %s ",(n->u).CREATETABLE.relname);
    if ((n->u).CREATETABLE.attrlist != (node *)0x0) {
      printf("where ");
      pnVar6 = (n->u).CREATETABLE.attrlist;
      goto LAB_0011a4fa;
    }
    break;
  case N_UPDATE:
    printf("update %s set ",(n->u).CREATETABLE.relname);
    print_relattr((n->u).CREATETABLE.attrlist);
    printf(" = ");
    pnVar6 = (n->u).QUERY.conditionlist;
    n_00 = (pnVar6->u).QUERY.relattrlist;
    if (n_00 == (NODE *)0x0) {
      print_value((pnVar6->u).CREATETABLE.attrlist);
    }
    else {
      print_relattr(n_00);
    }
    if ((n->u).UPDATE.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar6 = (n->u).UPDATE.conditionlist;
      goto LAB_0011a4fa;
    }
    break;
  default:
    goto switchD_0011a263_default;
  }
  pcVar14 = ";";
LAB_0011a506:
  puts(pcVar14);
switchD_0011a263_default:
  fflush(_stdout);
  pCVar11 = extraout_RDX_00;
LAB_0011a51a:
  RVar4 = 0;
  switch(n->kind) {
  case N_CREATETABLE:
    pcVar14 = (n->u).CREATETABLE.relname;
    sVar5 = strlen(pcVar14);
    if (sVar5 < 0x19) {
      pnVar6 = (n->u).CREATETABLE.attrlist;
      if (pnVar6 == (node *)0x0) {
        lVar10 = 0;
      }
      else {
        piVar16 = &attrInfos[0].attrLength;
        lVar10 = 0;
        do {
          if (lVar10 == 0x28) {
            nConditions = -2;
LAB_0011aa34:
            pcVar14 = "create";
            goto LAB_0011aacc;
          }
          pnVar15 = (pnVar6->u).QUERY.relattrlist;
          sVar5 = strlen((pnVar15->u).CREATETABLE.relname);
          if (0x18 < sVar5) {
            nConditions = -9;
            goto LAB_0011aa34;
          }
          iVar2 = __isoc99_sscanf((pnVar15->u).CREATETABLE.attrlist,"%c%d",&rhsValue,relAttrs);
          nConditions = -6;
          if (iVar2 == 2) {
            AVar3 = rhsValue.type & 0xff;
            if ((rhsValue.type & 0xff) < 0x6d) {
              if (AVar3 == 99) {
LAB_0011a62a:
                AVar3 = STRING;
                iVar2 = (int)relAttrs[0].relName;
                if (0xffffff00 < (int)relAttrs[0].relName - 0x100U) goto LAB_0011a688;
                nConditions = -7;
              }
              else if (AVar3 == 0x66) {
LAB_0011a65e:
                if ((int)relAttrs[0].relName == 4) {
                  AVar3 = FLOAT;
                  goto LAB_0011a683;
                }
                nConditions = -5;
              }
              else if (AVar3 == 0x69) {
                if ((int)relAttrs[0].relName == 4) {
                  AVar3 = INT;
                  goto LAB_0011a683;
                }
                nConditions = -4;
              }
            }
            else if ((rhsValue.type & 0xff) == 0x6d) {
              if ((int)relAttrs[0].relName == 4) {
                AVar3 = MBR;
                goto LAB_0011a683;
              }
              nConditions = -0xb;
            }
            else {
              if (AVar3 == 0x72) goto LAB_0011a65e;
              if (AVar3 == 0x73) goto LAB_0011a62a;
            }
            goto LAB_0011aa34;
          }
          if (iVar2 != 1) goto LAB_0011aa34;
          nConditions = -3;
          AVar7 = rhsValue.type & 0xff;
          if ((rhsValue.type & 0xff) < 0x6d) {
            if (AVar7 == 0x66) {
LAB_0011a657:
              AVar3 = FLOAT;
            }
            else {
              AVar3 = INT;
              if (AVar7 != 0x69) {
                if (AVar7 != 99) {
LAB_0011ab09:
                  nConditions = -6;
                }
                goto LAB_0011aa34;
              }
            }
          }
          else {
            if ((rhsValue.type & 0xff) != 0x6d) {
              if (AVar7 == 0x72) goto LAB_0011a657;
              if (AVar7 != 0x73) goto LAB_0011ab09;
              goto LAB_0011aa34;
            }
            AVar3 = MBR;
          }
          relAttrs[0].relName = (char *)CONCAT44(relAttrs[0].relName._4_4_,4);
LAB_0011a683:
          iVar2 = 4;
LAB_0011a688:
          ((AttrInfo *)(piVar16 + -3))->attrName = (pnVar15->u).CREATETABLE.relname;
          piVar16[-1] = AVar3;
          *piVar16 = iVar2;
          lVar10 = lVar10 + 1;
          pnVar6 = (pnVar6->u).CREATETABLE.attrlist;
          piVar16 = piVar16 + 4;
        } while (pnVar6 != (node *)0x0);
        pcVar14 = (n->u).CREATETABLE.relname;
      }
      RVar4 = SM_Manager::CreateTable(pSmm,pcVar14,(int)lVar10,attrInfos);
    }
    else {
      interp();
      RVar4 = 0;
    }
    break;
  case N_CREATEINDEX:
    RVar4 = SM_Manager::CreateIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar4;
  case N_DROPTABLE:
    RVar4 = SM_Manager::DropTable(pSmm,(n->u).CREATETABLE.relname);
    return RVar4;
  case N_DROPINDEX:
    RVar4 = SM_Manager::DropIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar4;
  case N_LOAD:
    RVar4 = SM_Manager::Load(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar4;
  case N_SET:
    RVar4 = SM_Manager::Set(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar4;
  case N_HELP:
    pcVar14 = (n->u).CREATETABLE.relname;
    if (pcVar14 == (char *)0x0) {
      RVar4 = SM_Manager::Help(pSmm);
      return RVar4;
    }
    RVar4 = SM_Manager::Help(pSmm,pcVar14);
    return RVar4;
  case N_PRINT:
    RVar4 = SM_Manager::Print(pSmm,(n->u).CREATETABLE.relname);
    return RVar4;
  case N_QUERY:
    pnVar6 = (n->u).QUERY.relattrlist;
    lVar10 = 0;
    lVar17 = 0;
    if (pnVar6 != (node *)0x0) {
      ppcVar9 = &relAttrs[0].attrName;
      lVar17 = 0;
      do {
        if (lVar17 == 0x28) goto LAB_0011a981;
        pnVar15 = (pnVar6->u).QUERY.relattrlist;
        ((RelAttr *)(ppcVar9 + -1))->relName = (pnVar15->u).CREATETABLE.relname;
        pCVar11 = (Condition *)(pnVar15->u).CREATETABLE.attrlist;
        *ppcVar9 = (char *)pCVar11;
        lVar17 = lVar17 + 1;
        pnVar6 = (pnVar6->u).CREATETABLE.attrlist;
        ppcVar9 = ppcVar9 + 2;
      } while (pnVar6 != (node *)0x0);
    }
    pnVar6 = (n->u).CREATETABLE.attrlist;
    if (pnVar6 != (node *)0x0) {
      lVar10 = 0;
      do {
        if (lVar10 == 0x28) goto LAB_0011a981;
        *(char **)(&rhsValue.type + lVar10 * 2) =
             (((pnVar6->u).QUERY.relattrlist)->u).CREATETABLE.relname;
        lVar10 = lVar10 + 1;
        pnVar6 = (pnVar6->u).CREATETABLE.attrlist;
      } while (pnVar6 != (node *)0x0);
    }
    nConditions = mk_conditions((n->u).QUERY.conditionlist,(int)(Condition *)attrInfos,pCVar11);
    if (-1 < nConditions) {
      RVar4 = QL_Manager::Select(pQlm,(int)lVar17,relAttrs,(int)lVar10,(char **)&rhsValue,
                                 nConditions,(Condition *)attrInfos);
      return RVar4;
    }
    pcVar14 = "select";
    goto LAB_0011aacc;
  case N_INSERT:
    pnVar6 = (n->u).CREATETABLE.attrlist;
    if (pnVar6 == (node *)0x0) {
      lVar10 = 0;
    }
    else {
      pAVar8 = &attrInfos[0].attrType;
      lVar10 = 0;
      do {
        if (lVar10 == 0x28) {
          pcVar14 = "insert";
          goto LAB_0011aa10;
        }
        pnVar15 = (pnVar6->u).QUERY.relattrlist;
        AVar3 = (pnVar15->u).VALUE.type;
        *(AttrType *)&((AttrInfo *)(pAVar8 + -2))->attrName = AVar3;
        switch(AVar3) {
        case INT:
          pnVar15 = (node *)((long)&pnVar15->u + 4);
          break;
        case FLOAT:
          pnVar15 = (node *)((long)&pnVar15->u + 8);
          break;
        case STRING:
          pnVar15 = (pnVar15->u).QUERY.conditionlist;
          break;
        case MBR:
          pnVar15 = (node *)((long)&pnVar15->u + 0x18);
          break;
        default:
          goto switchD_0011a768_default;
        }
        *(node **)pAVar8 = pnVar15;
switchD_0011a768_default:
        lVar10 = lVar10 + 1;
        pnVar6 = (pnVar6->u).CREATETABLE.attrlist;
        pAVar8 = pAVar8 + 4;
      } while (pnVar6 != (node *)0x0);
    }
    RVar4 = QL_Manager::Insert(pQlm,(n->u).CREATETABLE.relname,(int)lVar10,(Value *)attrInfos);
    break;
  case N_DELETE:
    iVar2 = mk_conditions((n->u).CREATETABLE.attrlist,(int)attrInfos,pCVar11);
    if (iVar2 < 0) {
      print_error("delete",iVar2);
      RVar4 = 0;
    }
    else {
      RVar4 = QL_Manager::Delete(pQlm,(n->u).CREATETABLE.relname,iVar2,(Condition *)attrInfos);
    }
    break;
  case N_UPDATE:
    pnVar6 = (n->u).CREATETABLE.attrlist;
    relAttrs[0].relName = (pnVar6->u).CREATETABLE.relname;
    relAttrs[0].attrName = (pnVar6->u).CREATEINDEX.attrname;
    pnVar6 = (n->u).QUERY.conditionlist;
    pnVar15 = (pnVar6->u).QUERY.relattrlist;
    if (pnVar15 == (node *)0x0) {
      pnVar6 = (pnVar6->u).CREATETABLE.attrlist;
      rhsValue.type = (pnVar6->u).VALUE.type;
      pCVar11 = (Condition *)(ulong)rhsValue.type;
      if (pCVar11 < (Condition *)0x4) {
        pRVar1 = (RelAttr *)&rhsValue;
        pCVar12 = (Condition *)
                  ((long)&switchD_0011a9b5::switchdataD_0011d8ac +
                  (long)(int)(&switchD_0011a9b5::switchdataD_0011d8ac)[(long)pCVar11]);
        switch(pCVar11) {
        case (Condition *)0x0:
          pnVar6 = (node *)((long)&pnVar6->u + 4);
          break;
        case (Condition *)0x1:
          pnVar6 = (node *)((long)&pnVar6->u + 8);
          break;
        case (Condition *)0x2:
          pnVar6 = (pnVar6->u).QUERY.conditionlist;
          break;
        case (Condition *)0x3:
          pnVar6 = (node *)((long)&pnVar6->u + 0x18);
        }
        iVar2 = 1;
        goto LAB_0011aa78;
      }
      iVar2 = 1;
    }
    else {
      pRVar1 = &local_cc8;
      pCVar12 = (Condition *)(pnVar15->u).QUERY.relattrlist;
      pnVar6 = (pnVar15->u).CREATETABLE.attrlist;
      iVar2 = 0;
      local_cc8.relName = (char *)pCVar12;
LAB_0011aa78:
      pRVar1->attrName = (char *)pnVar6;
      pCVar11 = pCVar12;
    }
    nConditions = mk_conditions((n->u).UPDATE.conditionlist,(int)(Condition *)attrInfos,pCVar11);
    if (-1 < nConditions) {
      RVar4 = QL_Manager::Update(pQlm,(n->u).CREATETABLE.relname,relAttrs,iVar2,&local_cc8,&rhsValue
                                 ,nConditions,(Condition *)attrInfos);
      return RVar4;
    }
    pcVar14 = "update";
LAB_0011aacc:
    print_error(pcVar14,nConditions);
    RVar4 = 0;
  }
  return RVar4;
LAB_0011a981:
  pcVar14 = "select";
LAB_0011aa10:
  nConditions = -2;
  goto LAB_0011aacc;
}

Assistant:

RC interp(NODE *n)
{
   RC errval = 0;         /* returned error value      */

   /* if input not coming from a terminal, then echo the query */
   if(!isatty(0))
      echo_query(n);

   switch(n -> kind){

      case N_CREATETABLE:            /* for CreateTable() */
         {
            int nattrs;
            AttrInfo attrInfos[MAXATTRS];

            /* Make sure relation name isn't too long */
            if(strlen(n -> u.CREATETABLE.relname) > MAXNAME){
               print_error((char*)"create", E_TOOLONG);
               break;
            }

            /* Make a list of AttrInfos suitable for sending to Create */
            nattrs = mk_attr_infos(n -> u.CREATETABLE.attrlist, MAXATTRS, 
                  attrInfos);
            if(nattrs < 0){
               print_error((char*)"create", nattrs);
               break;
            }

            /* Make the call to create */
            errval = pSmm->CreateTable(n->u.CREATETABLE.relname, nattrs, 
                  attrInfos);
            break;
         }   

      case N_CREATEINDEX:            /* for CreateIndex() */

         errval = pSmm->CreateIndex(n->u.CREATEINDEX.relname,
               n->u.CREATEINDEX.attrname);
         break;

      case N_DROPINDEX:            /* for DropIndex() */

         errval = pSmm->DropIndex(n->u.DROPINDEX.relname,
               n->u.DROPINDEX.attrname);
         break;

      case N_DROPTABLE:            /* for DropTable() */

         errval = pSmm->DropTable(n->u.DROPTABLE.relname);
         break;

      case N_LOAD:            /* for Load() */

         errval = pSmm->Load(n->u.LOAD.relname,
               n->u.LOAD.filename);
         break;

      case N_SET:                    /* for Set() */

         errval = pSmm->Set(n->u.SET.paramName,
               n->u.SET.string);
         break;

      case N_HELP:            /* for Help() */

         if (n->u.HELP.relname)
            errval = pSmm->Help(n->u.HELP.relname);
         else
            errval = pSmm->Help();
         break;

      case N_PRINT:            /* for Print() */

         errval = pSmm->Print(n->u.PRINT.relname);
         break;

      case N_QUERY:            /* for Query() */
         {
            int       nSelAttrs = 0;
            RelAttr  relAttrs[MAXATTRS];
            int       nRelations = 0;
            char      *relations[MAXATTRS];
            int       nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of RelAttrs suitable for sending to Query */
            nSelAttrs = mk_rel_attrs(n->u.QUERY.relattrlist, MAXATTRS,
                  relAttrs);
            if(nSelAttrs < 0){
               print_error((char*)"select", nSelAttrs);
               break;
            }

            /* Make a list of relation names suitable for sending to Query */
            nRelations = mk_relations(n->u.QUERY.rellist, MAXATTRS, relations);
            if(nRelations < 0){
               print_error((char*)"select", nRelations);
               break;
            }

            /* Make a list of Conditions suitable for sending to Query */
            nConditions = mk_conditions(n->u.QUERY.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"select", nConditions);
               break;
            }

            /* Make the call to Select */
            errval = pQlm->Select(nSelAttrs, relAttrs,
                  nRelations, relations,
                  nConditions, conditions);
            break;
         }   

      case N_INSERT:            /* for Insert() */
         {
            int nValues = 0;
            Value values[MAXATTRS];

            /* Make a list of Values suitable for sending to Insert */
            nValues = mk_values(n->u.INSERT.valuelist, MAXATTRS, values);
            if(nValues < 0){
               print_error((char*)"insert", nValues);
               break;
            }

            /* Make the call to insert */
            errval = pQlm->Insert(n->u.INSERT.relname,
                  nValues, values);
            break;
         }   

      case N_DELETE:            /* for Delete() */
         {
            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of Conditions suitable for sending to delete */
            nConditions = mk_conditions(n->u.DELETE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"delete", nConditions);
               break;
            }

            /* Make the call to delete */
            errval = pQlm->Delete(n->u.DELETE.relname,
                  nConditions, conditions);
            break;
         }   

      case N_UPDATE:            /* for Update() */
         {
            RelAttr relAttr;

            // The RHS can be either a value or an attribute
            Value rhsValue;
            RelAttr rhsRelAttr;
            int bIsValue;

            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a RelAttr suitable for sending to Update */
            mk_rel_attr(n->u.UPDATE.relattr, relAttr);

            struct node *rhs = n->u.UPDATE.relorvalue;
            if (rhs->u.RELATTR_OR_VALUE.relattr) {
               mk_rel_attr(rhs->u.RELATTR_OR_VALUE.relattr, rhsRelAttr);
               bIsValue = 0;
            } else {
               /* Make a value suitable for sending to update */
               mk_value(rhs->u.RELATTR_OR_VALUE.value, rhsValue);
               bIsValue = 1;
            }

            /* Make a list of Conditions suitable for sending to Update */
            nConditions = mk_conditions(n->u.UPDATE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"update", nConditions);
               break;
            }

            /* Make the call to update */
            errval = pQlm->Update(n->u.UPDATE.relname, relAttr, bIsValue, 
                  rhsRelAttr, rhsValue, nConditions, conditions);
            break;
         }   

      default:   // should never get here
         break;
   }

   return (errval);
}